

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_between_expression.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,BetweenExpression *expr,
          idx_t depth)

{
  ClientContext *pCVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  type pPVar6;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_02;
  type pEVar7;
  pointer pEVar8;
  BinderException *pBVar9;
  pointer *__ptr;
  unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
  local_278;
  long *local_270;
  ExpressionType local_261;
  undefined1 local_260 [32];
  undefined1 local_240 [16];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_230;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_228;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_220;
  LogicalType input_type;
  LogicalType upper_sql_type;
  LogicalType lower_sql_type;
  LogicalType input_sql_type;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  ErrorData error;
  ErrorData local_b0;
  
  ErrorData::ErrorData(&error);
  BindChild(this,&expr->input,depth,&error);
  BindChild(this,&expr->lower,depth,&error);
  BindChild(this,&expr->upper,depth,&error);
  if (error.initialized == true) {
    ErrorData::ErrorData(&local_b0,&error);
    BindResult::BindResult(__return_storage_ptr__,&local_b0);
    ErrorData::~ErrorData(&local_b0);
    goto LAB_005c7225;
  }
  pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*(&expr->input);
  this_00 = BoundExpression::GetExpression(pPVar6);
  pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*(&expr->lower);
  this_01 = BoundExpression::GetExpression(pPVar6);
  pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*(&expr->upper);
  this_02 = BoundExpression::GetExpression(pPVar6);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (this_00);
  GetExpressionReturnType(&input_sql_type,pEVar7);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (this_01);
  GetExpressionReturnType(&lower_sql_type,pEVar7);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (this_02);
  GetExpressionReturnType(&upper_sql_type,pEVar7);
  LogicalType::LogicalType(&input_type);
  bVar4 = BoundComparisonExpression::TryBindComparison
                    (this->context,&input_sql_type,&lower_sql_type,&input_type,
                     (expr->super_ParsedExpression).super_BaseExpression.type);
  if (!bVar4) {
    pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)local_260,
               "Cannot mix values of type %s and %s in BETWEEN clause - an explicit cast is required"
               ,(allocator *)&local_278);
    LogicalType::ToString_abi_cxx11_(&local_150,&input_sql_type);
    LogicalType::ToString_abi_cxx11_(&local_170,&lower_sql_type);
    BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
              (pBVar9,&expr->super_ParsedExpression,(string *)local_260,&local_150,&local_170);
    __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar4 = BoundComparisonExpression::TryBindComparison
                    (this->context,&input_type,&upper_sql_type,&input_type,
                     (expr->super_ParsedExpression).super_BaseExpression.type);
  if (!bVar4) {
    pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)local_260,
               "Cannot mix values of type %s and %s in BETWEEN clause - an explicit cast is required"
               ,(allocator *)&local_278);
    LogicalType::ToString_abi_cxx11_(&local_190,&input_type);
    LogicalType::ToString_abi_cxx11_(&local_1b0,&upper_sql_type);
    BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
              (pBVar9,&expr->super_ParsedExpression,(string *)local_260,&local_190,&local_1b0);
    __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar1 = this->context;
  local_220._M_head_impl =
       (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddCastToType
            ((BoundCastExpression *)local_260,pCVar1,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_220,&input_type,false);
  uVar3 = local_260._0_8_;
  local_260._0_8_ = (BoundComparisonExpression *)0x0;
  _Var2._M_head_impl =
       (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar3;
  if (_Var2._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
  }
  if ((_Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
       )local_260._0_8_ != (BoundComparisonExpression *)0x0) {
    (**(code **)(*(_func_int **)local_260._0_8_ + 8))();
  }
  local_260._0_8_ =
       (_Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
        )0x0;
  if (local_220._M_head_impl != (Expression *)0x0) {
    (*((local_220._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_220._M_head_impl = (Expression *)0x0;
  pCVar1 = this->context;
  local_228._M_head_impl =
       (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddCastToType
            ((BoundCastExpression *)local_260,pCVar1,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_228,&input_type,false);
  uVar3 = local_260._0_8_;
  local_260._0_8_ = (BoundComparisonExpression *)0x0;
  _Var2._M_head_impl =
       (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar3;
  if (_Var2._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
  }
  if ((_Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
       )local_260._0_8_ != (BoundComparisonExpression *)0x0) {
    (**(code **)(*(_func_int **)local_260._0_8_ + 8))();
  }
  local_260._0_8_ =
       (_Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
        )0x0;
  if (local_228._M_head_impl != (Expression *)0x0) {
    (*((local_228._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_228._M_head_impl = (Expression *)0x0;
  pCVar1 = this->context;
  local_230._M_head_impl =
       (this_02->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (this_02->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddCastToType
            ((BoundCastExpression *)local_260,pCVar1,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_230,&input_type,false);
  uVar3 = local_260._0_8_;
  local_260._0_8_ = (BoundComparisonExpression *)0x0;
  _Var2._M_head_impl =
       (this_02->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (this_02->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar3;
  if (_Var2._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
  }
  if ((_Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
       )local_260._0_8_ != (BoundComparisonExpression *)0x0) {
    (**(code **)(*(_func_int **)local_260._0_8_ + 8))();
  }
  local_260._0_8_ =
       (_Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
        )0x0;
  if (local_230._M_head_impl != (Expression *)0x0) {
    (*((local_230._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_230._M_head_impl = (Expression *)0x0;
  PushCollation(this->context,this_00,&input_type,ALL_COLLATIONS);
  PushCollation(this->context,this_01,&input_type,ALL_COLLATIONS);
  PushCollation(this->context,this_02,&input_type,ALL_COLLATIONS);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  iVar5 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0xc])(pEVar8);
  if ((char)iVar5 == '\0') {
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    iVar5 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[6])(pEVar8);
    if ((char)iVar5 != '\0') goto LAB_005c7190;
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    iVar5 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[4])(pEVar8);
    if ((char)iVar5 != '\0') goto LAB_005c7190;
    local_270 = (long *)CONCAT71(local_270._1_7_,0x1e);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_278,pEVar8);
    make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((duckdb *)local_260,(ExpressionType *)&local_270,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_278,this_01);
    if ((long *)CONCAT71(local_278.
                         super_unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
                         .super__Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false>.
                         _M_head_impl._1_7_,
                         local_278.
                         super_unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
                         .super__Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false>.
                         _M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_278.
                                     super_unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
                                     ._M_t.
                                     super___uniq_ptr_impl<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
                                     .
                                     super__Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_278.
                                     super_unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
                                     ._M_t.
                                     super___uniq_ptr_impl<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
                                     .
                                     super__Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
    local_270 = (long *)CONCAT71(local_270._1_7_,0x1d);
    make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((duckdb *)&local_278,(ExpressionType *)&local_270,this_00,this_02);
    local_261 = CONJUNCTION_AND;
    make_uniq<duckdb::BoundConjunctionExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::BoundComparisonExpression,std::default_delete<duckdb::BoundComparisonExpression>,true>,duckdb::unique_ptr<duckdb::BoundComparisonExpression,std::default_delete<duckdb::BoundComparisonExpression>,true>>
              ((duckdb *)&local_270,&local_261,
               (unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
                *)local_260,&local_278);
    local_240._8_8_ = local_270;
    local_270 = (long *)0x0;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               (local_240 + 8));
    if ((long *)local_240._8_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_240._8_8_ + 8))();
    }
    local_240._8_8_ = 0;
    if (local_270 != (long *)0x0) {
      (**(code **)(*local_270 + 8))();
    }
    if ((long *)CONCAT71(local_278.
                         super_unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
                         .super__Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false>.
                         _M_head_impl._1_7_,
                         local_278.
                         super_unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
                         .super__Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false>.
                         _M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_278.
                                     super_unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
                                     ._M_t.
                                     super___uniq_ptr_impl<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
                                     .
                                     super__Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_278.
                                     super_unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
                                     ._M_t.
                                     super___uniq_ptr_impl<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
                                     .
                                     super__Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  else {
LAB_005c7190:
    local_278.
    super_unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
    .super__Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false>._M_head_impl._0_1_ =
         (duckdb)0x1;
    local_270 = (long *)CONCAT71(local_270._1_7_,1);
    make_uniq<duckdb::BoundBetweenExpression,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,bool,bool>
              ((duckdb *)local_260,this_00,this_01,this_02,(bool *)&local_278,(bool *)&local_270);
    local_240._0_8_ = local_260._0_8_;
    local_260._0_8_ =
         (__uniq_ptr_data<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true,_true>
          )0x0;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_240);
    if ((Expression *)local_240._0_8_ != (Expression *)0x0) {
      (**(code **)(*(long *)local_240._0_8_ + 8))();
    }
    local_240._0_8_ = 0;
  }
  if ((_Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
       )local_260._0_8_ != (BoundComparisonExpression *)0x0) {
    (*(((Expression *)local_260._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  LogicalType::~LogicalType(&input_type);
  LogicalType::~LogicalType(&upper_sql_type);
  LogicalType::~LogicalType(&lower_sql_type);
  LogicalType::~LogicalType(&input_sql_type);
LAB_005c7225:
  ErrorData::~ErrorData(&error);
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindExpression(BetweenExpression &expr, idx_t depth) {
	// first try to bind the children of the case expression
	ErrorData error;
	BindChild(expr.input, depth, error);
	BindChild(expr.lower, depth, error);
	BindChild(expr.upper, depth, error);
	if (error.HasError()) {
		return BindResult(std::move(error));
	}
	// the children have been successfully resolved
	auto &input = BoundExpression::GetExpression(*expr.input);
	auto &lower = BoundExpression::GetExpression(*expr.lower);
	auto &upper = BoundExpression::GetExpression(*expr.upper);

	auto input_sql_type = ExpressionBinder::GetExpressionReturnType(*input);
	auto lower_sql_type = ExpressionBinder::GetExpressionReturnType(*lower);
	auto upper_sql_type = ExpressionBinder::GetExpressionReturnType(*upper);

	// cast the input types to the same type
	// now obtain the result type of the input types
	LogicalType input_type;
	if (!BoundComparisonExpression::TryBindComparison(context, input_sql_type, lower_sql_type, input_type,
	                                                  expr.GetExpressionType())) {

		throw BinderException(expr,
		                      "Cannot mix values of type %s and %s in BETWEEN clause - an explicit cast is required",
		                      input_sql_type.ToString(), lower_sql_type.ToString());
	}
	if (!BoundComparisonExpression::TryBindComparison(context, input_type, upper_sql_type, input_type,
	                                                  expr.GetExpressionType())) {
		throw BinderException(expr,
		                      "Cannot mix values of type %s and %s in BETWEEN clause - an explicit cast is required",
		                      input_type.ToString(), upper_sql_type.ToString());
	}
	// add casts (if necessary)
	input = BoundCastExpression::AddCastToType(context, std::move(input), input_type);
	lower = BoundCastExpression::AddCastToType(context, std::move(lower), input_type);
	upper = BoundCastExpression::AddCastToType(context, std::move(upper), input_type);
	// handle collation
	PushCollation(context, input, input_type);
	PushCollation(context, lower, input_type);
	PushCollation(context, upper, input_type);

	if (!input->IsVolatile() && !input->HasParameter() && !input->HasSubquery()) {
		// the expression does not have side effects and can be copied: create two comparisons
		// the reason we do this is that individual comparisons are easier to handle in optimizers
		// if both comparisons remain they will be folded together again into a single BETWEEN in the optimizer
		auto left_compare = make_uniq<BoundComparisonExpression>(ExpressionType::COMPARE_GREATERTHANOREQUALTO,
		                                                         input->Copy(), std::move(lower));
		auto right_compare = make_uniq<BoundComparisonExpression>(ExpressionType::COMPARE_LESSTHANOREQUALTO,
		                                                          std::move(input), std::move(upper));
		return BindResult(make_uniq<BoundConjunctionExpression>(ExpressionType::CONJUNCTION_AND,
		                                                        std::move(left_compare), std::move(right_compare)));
	} else {
		// expression has side effects: we cannot duplicate it
		// create a bound_between directly
		return BindResult(
		    make_uniq<BoundBetweenExpression>(std::move(input), std::move(lower), std::move(upper), true, true));
	}
}